

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CS248::Face::getAxes(Face *this,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *axes)

{
  double dVar1;
  pointer pVVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  double dVar6;
  long lVar7;
  _List_node_base *p_Var8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector3D local_30;
  
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::resize(axes,3);
  normal(&local_30,this);
  pVVar2 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].z = local_30.z;
  pVVar2[2].x = local_30.x;
  pVVar2[2].y = local_30.y;
  p_Var3 = (this->_halfedge)._M_node;
  lVar7 = 4;
  p_Var8 = p_Var3;
  do {
    p_Var8 = p_Var8[2]._M_next;
    lVar7 = lVar7 + -1;
  } while (p_Var3 != p_Var8);
  p_Var3 = (this->_halfedge)._M_node;
  p_Var8 = p_Var3[2]._M_next;
  p_Var3 = p_Var3[2]._M_prev;
  p_Var4 = p_Var8[2]._M_prev;
  if (lVar7 == 0) {
    p_Var8 = p_Var8[2]._M_next;
    p_Var5 = p_Var8[2]._M_prev;
    p_Var8 = p_Var8[2]._M_next[2]._M_prev;
    dVar10 = ((double)p_Var5[1]._M_prev - (double)p_Var8[1]._M_prev) +
             ((double)p_Var4[1]._M_prev - (double)p_Var3[1]._M_prev);
    dVar11 = ((double)p_Var5[2]._M_next - (double)p_Var8[2]._M_next) +
             ((double)p_Var4[2]._M_next - (double)p_Var3[2]._M_next);
    dVar9 = ((double)p_Var5[2]._M_prev - (double)p_Var8[2]._M_prev) +
            ((double)p_Var4[2]._M_prev - (double)p_Var3[2]._M_prev);
  }
  else {
    dVar10 = (double)p_Var4[1]._M_prev - (double)p_Var3[1]._M_prev;
    dVar11 = (double)p_Var4[2]._M_next - (double)p_Var3[2]._M_next;
    dVar9 = (double)p_Var4[2]._M_prev - (double)p_Var3[2]._M_prev;
  }
  pVVar2 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pVVar2[2].z;
  dVar12 = dVar9 * dVar1 + dVar10 * pVVar2[2].x + dVar11 * pVVar2[2].y;
  dVar10 = dVar10 - dVar12 * pVVar2[2].x;
  dVar11 = dVar11 - dVar12 * pVVar2[2].y;
  pVVar2->x = dVar10;
  pVVar2->y = dVar11;
  dVar9 = dVar9 - dVar1 * dVar12;
  pVVar2->z = dVar9;
  dVar9 = dVar9 * dVar9 + dVar10 * dVar10 + dVar11 * dVar11;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar9 = 1.0 / dVar9;
  pVVar2->x = dVar9 * pVVar2->x;
  pVVar2->y = dVar9 * pVVar2->y;
  pVVar2->z = dVar9 * pVVar2->z;
  pVVar2 = (axes->super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar9 = pVVar2->x;
  dVar10 = pVVar2[2].x;
  dVar11 = pVVar2[2].y;
  dVar1 = pVVar2[2].z;
  dVar12 = pVVar2->y;
  dVar6 = pVVar2->z;
  pVVar2[1].x = dVar6 * dVar11 - dVar1 * dVar12;
  pVVar2[1].y = dVar9 * dVar1 - dVar10 * dVar6;
  pVVar2[1].z = dVar10 * dVar12 - dVar9 * dVar11;
  return;
}

Assistant:

void Face::getAxes(vector<Vector3D>& axes) const {
  axes.resize(3);

  // Set the Z direction to the face normal
  axes[2] = normal();

  if (degree() == 4) {
    // For quads, we'll try to roughly align the X direction
    // with one of the principal axes of the quad.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;
    h = h->next();
    Vector3D p2 = h->vertex()->position;
    h = h->next();
    Vector3D p3 = h->vertex()->position;

    axes[0] = (p1 - p0) + (p2 - p3);
  } else {
    // Otherwise, we'll just use an arbitrary edge
    // to determine the direction of the X-axis.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;

    axes[0] = p1 - p0;
  }

  // Make X orthonormal to Z
  axes[0] -= dot(axes[0], axes[2]) * axes[2];
  axes[0].normalize();

  // Choose the Y direction so that X x Y = Z
  axes[1] = cross(axes[2], axes[0]);
}